

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

void __thiscall
basisu::vector<std::pair<basisu::vec<6U,_float>,_unsigned_long>_>::push_back
          (vector<std::pair<basisu::vec<6U,_float>,_unsigned_long>_> *this,
          pair<basisu::vec<6U,_float>,_unsigned_long> *obj)

{
  uint uVar1;
  pair<basisu::vec<6U,_float>,_unsigned_long> *ppVar2;
  ulong uVar3;
  
  ppVar2 = this->m_p;
  uVar1 = this->m_size;
  uVar3 = (ulong)uVar1;
  if (ppVar2 + uVar3 <= obj ||
      (obj < ppVar2 || ppVar2 == (pair<basisu::vec<6U,_float>,_unsigned_long> *)0x0)) {
    if (this->m_capacity <= uVar1) {
      increase_capacity(this,uVar1 + 1,true,false);
      ppVar2 = this->m_p;
      uVar3 = (ulong)this->m_size;
    }
    std::pair<basisu::vec<6U,_float>,_unsigned_long>::pair(ppVar2 + uVar3,obj);
    this->m_size = this->m_size + 1;
    return;
  }
  __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x267,
                "void basisu::vector<std::pair<basisu::vec<6, float>, unsigned long>>::push_back(const T &) [T = std::pair<basisu::vec<6, float>, unsigned long>]"
               );
}

Assistant:

BASISU_FORCE_INLINE void push_back(const T& obj)
      {
         assert(!m_p || (&obj < m_p) || (&obj >= (m_p + m_size)));

         if (m_size >= m_capacity)
            increase_capacity(m_size + 1, true);

         scalar_type<T>::construct(m_p + m_size, obj);
         m_size++;
      }